

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SOCK5ConnectionMaker.cpp
# Opt level: O0

SOCK5ConnectionMaker * __thiscall
SOCK5ConnectionMaker::getHost_abi_cxx11_(SOCK5ConnectionMaker *this)

{
  long in_RSI;
  SOCK5ConnectionMaker *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)(in_RSI + 0x818));
  return this;
}

Assistant:

std::string SOCK5ConnectionMaker::getHost() {
    return addr;
}